

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool runTest(size_t index,size_t total,char *name,TestFunc *func)

{
  printf("Test %d/%d: %s\n...................................................................\n",
         index,total,name);
  (*func)();
  printf("\n>>> Passed\n\n");
  return true;
}

Assistant:

bool
runTest(
	size_t index,
	size_t total,
	const char* name,
	TestFunc* func
) {
	printf(
		"Test %d/%d: %s\n"
		"...................................................................\n",
		index,
		total,
		name
	);

	bool result = true;
	try {
		func();
	} catch (const char* message) {
		printf("%s\n", message);
		result = false;
	} catch (...) {
		result = false;
	}

	printf(result ? "\n>>> Passed\n\n" : "\n>>> FAILED\n\n");
	return result;
}